

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_d021dd::HandleInstall
               (cmInstalledFile *file,cmMakefile *makefile,string *propertyName,
               string *propertyValue,bool appendAsString,bool appendMode,bool remove)

{
  bool remove_local;
  bool appendMode_local;
  bool appendAsString_local;
  string *propertyValue_local;
  string *propertyName_local;
  cmMakefile *makefile_local;
  cmInstalledFile *file_local;
  
  if (remove) {
    cmInstalledFile::RemoveProperty(file,propertyName);
  }
  else if (appendMode) {
    cmInstalledFile::AppendProperty(file,makefile,propertyName,propertyValue,appendAsString);
  }
  else {
    cmInstalledFile::SetProperty(file,makefile,propertyName,propertyValue);
  }
  return true;
}

Assistant:

bool HandleInstall(cmInstalledFile* file, cmMakefile& makefile,
                   const std::string& propertyName,
                   const std::string& propertyValue, bool appendAsString,
                   bool appendMode, bool remove)
{
  // Set or append the property.
  if (remove) {
    file->RemoveProperty(propertyName);
  } else if (appendMode) {
    file->AppendProperty(&makefile, propertyName, propertyValue,
                         appendAsString);
  } else {
    file->SetProperty(&makefile, propertyName, propertyValue);
  }
  return true;
}